

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlc.h
# Opt level: O0

int Wlc_ObjIsSignedFanin01(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  Wlc_Obj_t *pWVar1;
  bool local_1d;
  uint local_1c;
  Wlc_Obj_t *pObj_local;
  Wlc_Ntk_t *p_local;
  
  if (p->fSmtLib == 0) {
    pWVar1 = Wlc_ObjFanin0(p,pObj);
    local_1d = false;
    if ((*(ushort *)pWVar1 >> 6 & 1) != 0) {
      pWVar1 = Wlc_ObjFanin1(p,pObj);
      local_1d = (*(ushort *)pWVar1 >> 6 & 1) != 0;
    }
    local_1c = (uint)local_1d;
  }
  else {
    local_1c = Wlc_ObjIsSigned(pObj);
  }
  return local_1c;
}

Assistant:

static inline int          Wlc_ObjIsSignedFanin01( Wlc_Ntk_t * p, Wlc_Obj_t * pObj ){ return p->fSmtLib ? Wlc_ObjIsSigned(pObj) : (Wlc_ObjFanin0(p, pObj)->Signed && Wlc_ObjFanin1(p, pObj)->Signed); }